

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O1

bool wasm::Match::Internal::
     Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
     ::match(matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
             candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
            *matchers)

{
  BinaryOp BVar1;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> pBVar2;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  *pMVar3;
  matched_t<wasm::Const_*> pCVar4;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *pMVar5;
  matched_t<wasm::Const_*> *ppCVar6;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *ppEVar7;
  bool bVar8;
  BinaryOp BVar9;
  Literal local_48;
  
  pBVar2 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
            )candidate->left;
  if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id != BinaryId)
  {
    return false;
  }
  pMVar3 = matchers->curr;
  if (pMVar3->binder !=
      (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> *)
      0x0) {
    *pMVar3->binder = pBVar2;
  }
  BVar1 = pBVar2->op;
  BVar9 = Abstract::getBinary((Type)(pBVar2->left->type).id,pMVar3->data);
  if (BVar1 == BVar9) {
    pCVar4 = (matched_t<wasm::Const_*>)pBVar2->left;
    if ((pCVar4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id != ConstId
       ) {
      return false;
    }
    pMVar5 = (pMVar3->submatchers).curr;
    ppCVar6 = pMVar5->binder;
    if (ppCVar6 != (matched_t<wasm::Const_*> *)0x0) {
      *ppCVar6 = pCVar4;
    }
    Literal::Literal(&local_48,&pCVar4->value);
    bVar8 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
            ::matches(&(pMVar5->submatchers).curr,&local_48);
    Literal::~Literal(&local_48);
    if (bVar8) {
      ppEVar7 = ((pMVar3->submatchers).next.curr)->binder;
      if (ppEVar7 != (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
        *ppEVar7 = pBVar2->right;
      }
      ppEVar7 = ((matchers->next).curr)->binder;
      if (ppEVar7 == (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
        return true;
      }
      *ppEVar7 = candidate->right;
      return true;
    }
  }
  return false;
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }